

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::
field<char[9],std::vector<std::unique_ptr<pstack::Elf::Section,std::default_delete<pstack::Elf::Section>>,std::allocator<std::unique_ptr<pstack::Elf::Section,std::default_delete<pstack::Elf::Section>>>>,char>
          (JObject *this,char (*k) [9],
          vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>
          *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[9],_std::vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>_>,_char>
  local_48;
  undefined1 local_38 [8];
  Field<char[9],_std::vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>_>
  field;
  char *c_local;
  vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>
  *v_local;
  char (*k_local) [9];
  JObject *this_local;
  
  field.v = (vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>
             *)c;
  Field<char[9],_std::vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>_>
  ::Field((Field<char[9],_std::vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>_>
           *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[9],std::vector<std::unique_ptr<pstack::Elf::Section,std::default_delete<pstack::Elf::Section>>,std::allocator<std::unique_ptr<pstack::Elf::Section,std::default_delete<pstack::Elf::Section>>>>>,char>
                       ((Field<char[9],_std::vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>_>
                         *)local_38,(char *)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }